

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O1

int trytop(rnndb *db,char *file,xmlNode *node)

{
  xmlChar *pxVar1;
  xmlAttr *attr;
  xmlNode *attr_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint64_t uVar7;
  rnnenum *prVar8;
  rnnenum **pprVar9;
  rnnvalue *prVar10;
  rnnvalue **pprVar11;
  char *pcVar12;
  char *pcVar13;
  rnnbitset *prVar14;
  rnnbitset **pprVar15;
  rnnbitfield *prVar16;
  rnnbitfield **pprVar17;
  rnnspectype *prVar18;
  rnnspectype **pprVar19;
  rnngroup *prVar20;
  rnngroup **pprVar21;
  rnndomain *prVar22;
  rnndomain **pprVar23;
  rnnauthor *prVar24;
  char *pcVar25;
  char **ppcVar26;
  rnnauthor **pprVar27;
  rnndelem *prVar28;
  rnndelem **pprVar29;
  ulong uVar30;
  xmlNode *node_00;
  xmlNode *node_01;
  xmlNode *node_02;
  xmlNode *node_03;
  xmlNode *node_04;
  _xmlNode *p_Var31;
  _xmlAttr *p_Var32;
  long lVar33;
  rnndb *prVar34;
  char *local_60;
  uint64_t local_50;
  char *local_48;
  char *local_40;
  
  pxVar1 = node->name;
  iVar2 = strcmp((char *)pxVar1,"enum");
  if (iVar2 == 0) {
    p_Var32 = node->properties;
    if (p_Var32 == (_xmlAttr *)0x0) {
      pcVar25 = (char *)0x0;
      iVar4 = 0;
      iVar2 = 0;
      local_60 = (char *)0x0;
      local_48 = (char *)0x0;
      local_40 = (char *)0x0;
    }
    else {
      local_40 = (char *)0x0;
      local_48 = (char *)0x0;
      local_60 = (char *)0x0;
      iVar2 = 0;
      iVar4 = 0;
      pcVar25 = (char *)0x0;
      do {
        pxVar1 = p_Var32->name;
        iVar5 = strcmp((char *)pxVar1,"name");
        if (iVar5 == 0) {
          pcVar25 = getattrib(db,file,(uint)node->line,p_Var32);
        }
        else {
          iVar5 = strcmp((char *)pxVar1,"bare");
          if (iVar5 == 0) {
            iVar2 = getboolattrib(db,file,(uint)node->line,p_Var32);
          }
          else {
            iVar5 = strcmp((char *)pxVar1,"inline");
            if (iVar5 == 0) {
              iVar4 = getboolattrib(db,file,(uint)node->line,p_Var32);
            }
            else {
              iVar5 = strcmp((char *)pxVar1,"prefix");
              if (iVar5 == 0) {
                pcVar13 = getattrib(db,file,(uint)node->line,p_Var32);
                local_60 = strdup(pcVar13);
              }
              else {
                iVar5 = strcmp((char *)pxVar1,"varset");
                if (iVar5 == 0) {
                  pcVar13 = getattrib(db,file,(uint)node->line,p_Var32);
                  local_48 = strdup(pcVar13);
                }
                else {
                  iVar5 = strcmp((char *)pxVar1,"variants");
                  if (iVar5 == 0) {
                    pcVar13 = getattrib(db,file,(uint)node->line,p_Var32);
                    local_40 = strdup(pcVar13);
                  }
                  else {
                    fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for enum\n",file,
                            (ulong)node->line,pxVar1);
                    db->estatus = 1;
                  }
                }
              }
            }
          }
        }
        p_Var32 = p_Var32->next;
      } while (p_Var32 != (_xmlAttr *)0x0);
    }
    if (pcVar25 != (char *)0x0) {
      iVar5 = db->enumsnum;
      if (0 < (long)iVar5) {
        pprVar9 = db->enums;
        lVar33 = 0;
        do {
          prVar8 = pprVar9[lVar33];
          iVar3 = strcmp(prVar8->name,pcVar25);
          if (iVar3 == 0) goto LAB_0010309d;
          lVar33 = lVar33 + 1;
        } while (iVar5 != lVar33);
      }
      prVar8 = (rnnenum *)0x0;
LAB_0010309d:
      if (prVar8 == (rnnenum *)0x0) {
        prVar8 = (rnnenum *)calloc(0x78,1);
        pcVar25 = strdup(pcVar25);
        prVar8->name = pcVar25;
        prVar8->isinline = iVar4;
        prVar8->bare = iVar2;
        (prVar8->varinfo).prefixstr = local_60;
        (prVar8->varinfo).varsetstr = local_48;
        (prVar8->varinfo).variantsstr = local_40;
        prVar8->file = file;
        iVar2 = db->enumsmax;
        if (iVar2 <= iVar5) {
          iVar4 = 0x10;
          if (iVar2 != 0) {
            iVar4 = iVar2 * 2;
          }
          db->enumsmax = iVar4;
          pprVar9 = (rnnenum **)realloc(db->enums,(long)iVar4 << 3);
          db->enums = pprVar9;
        }
        iVar2 = db->enumsnum;
        db->enumsnum = iVar2 + 1;
        db->enums[iVar2] = prVar8;
      }
      else {
        pcVar25 = (prVar8->varinfo).prefixstr;
        if (((((local_60 != (char *)0x0 || pcVar25 != (char *)0x0) &&
              (((local_60 == (char *)0x0 || (pcVar25 == (char *)0x0)) ||
               (iVar5 = strcmp(pcVar25,local_60), iVar5 != 0)))) ||
             ((pcVar25 = (prVar8->varinfo).varsetstr,
              local_48 != (char *)0x0 || pcVar25 != (char *)0x0 &&
              (((local_48 == (char *)0x0 || (pcVar25 == (char *)0x0)) ||
               (iVar5 = strcmp(pcVar25,local_48), iVar5 != 0)))))) ||
            ((pcVar25 = (prVar8->varinfo).variantsstr,
             local_40 != (char *)0x0 || pcVar25 != (char *)0x0 &&
             (((local_40 == (char *)0x0 || (pcVar25 == (char *)0x0)) ||
              (iVar5 = strcmp(pcVar25,local_40), iVar5 != 0)))))) ||
           ((prVar8->isinline != iVar4 || (prVar8->bare != iVar2)))) {
          fprintf(_stderr,"%s:%d: merge fail for enum %s\n",file,(ulong)node->line,node->name);
          db->estatus = 1;
        }
      }
      for (prVar34 = (rnndb *)node->children; prVar34 != (rnndb *)0x0;
          prVar34 = (rnndb *)prVar34->bitsets) {
        if (*(int *)&(prVar34->copyright).license == 1) {
          iVar2 = strcmp((char *)(prVar34->copyright).authors,"value");
          if (iVar2 == 0) {
            prVar10 = parsevalue(db,file,(xmlNode *)prVar34);
            if (prVar10 != (rnnvalue *)0x0) {
              iVar2 = prVar8->valsmax;
              if (iVar2 <= prVar8->valsnum) {
                iVar4 = iVar2 * 2;
                if (iVar2 == 0) {
                  iVar4 = 0x10;
                }
                prVar8->valsmax = iVar4;
                pprVar11 = (rnnvalue **)realloc(prVar8->vals,(long)iVar4 << 3);
                prVar8->vals = pprVar11;
              }
              iVar2 = prVar8->valsnum;
              prVar8->valsnum = iVar2 + 1;
              prVar8->vals[iVar2] = prVar10;
            }
          }
          else {
            pcVar25 = file;
            iVar2 = trytop(db,file,(xmlNode *)prVar34);
            if ((iVar2 == 0) && (iVar2 = trydoc(prVar34,pcVar25,node_00), iVar2 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in enum: <%s>\n",file,
                      (ulong)*(ushort *)&prVar34->files,(prVar34->copyright).authors);
              db->estatus = 1;
            }
          }
        }
      }
      return 1;
    }
    uVar30 = (ulong)node->line;
    pcVar25 = "%s:%d: nameless enum\n";
LAB_00104312:
    fprintf(_stderr,pcVar25,file,uVar30);
    db->estatus = 1;
    return 1;
  }
  iVar2 = strcmp((char *)pxVar1,"bitset");
  if (iVar2 == 0) {
    p_Var32 = node->properties;
    if (p_Var32 == (_xmlAttr *)0x0) {
      pcVar25 = (char *)0x0;
      iVar4 = 0;
      iVar2 = 0;
      local_60 = (char *)0x0;
      local_48 = (char *)0x0;
      local_40 = (char *)0x0;
    }
    else {
      local_40 = (char *)0x0;
      local_48 = (char *)0x0;
      local_60 = (char *)0x0;
      iVar2 = 0;
      iVar4 = 0;
      pcVar25 = (char *)0x0;
      do {
        pxVar1 = p_Var32->name;
        iVar5 = strcmp((char *)pxVar1,"name");
        if (iVar5 == 0) {
          pcVar25 = getattrib(db,file,(uint)node->line,p_Var32);
        }
        else {
          iVar5 = strcmp((char *)pxVar1,"bare");
          if (iVar5 == 0) {
            iVar2 = getboolattrib(db,file,(uint)node->line,p_Var32);
          }
          else {
            iVar5 = strcmp((char *)pxVar1,"inline");
            if (iVar5 == 0) {
              iVar4 = getboolattrib(db,file,(uint)node->line,p_Var32);
            }
            else {
              iVar5 = strcmp((char *)pxVar1,"prefix");
              if (iVar5 == 0) {
                pcVar13 = getattrib(db,file,(uint)node->line,p_Var32);
                local_60 = strdup(pcVar13);
              }
              else {
                iVar5 = strcmp((char *)pxVar1,"varset");
                if (iVar5 == 0) {
                  pcVar13 = getattrib(db,file,(uint)node->line,p_Var32);
                  local_48 = strdup(pcVar13);
                }
                else {
                  iVar5 = strcmp((char *)pxVar1,"variants");
                  if (iVar5 == 0) {
                    pcVar13 = getattrib(db,file,(uint)node->line,p_Var32);
                    local_40 = strdup(pcVar13);
                  }
                  else {
                    fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for bitset\n",file,
                            (ulong)node->line,pxVar1);
                    db->estatus = 1;
                  }
                }
              }
            }
          }
        }
        p_Var32 = p_Var32->next;
      } while (p_Var32 != (_xmlAttr *)0x0);
    }
    if (pcVar25 != (char *)0x0) {
      iVar5 = db->bitsetsnum;
      if (0 < (long)iVar5) {
        pprVar15 = db->bitsets;
        lVar33 = 0;
        do {
          prVar14 = pprVar15[lVar33];
          iVar3 = strcmp(prVar14->name,pcVar25);
          if (iVar3 == 0) goto LAB_0010356d;
          lVar33 = lVar33 + 1;
        } while (iVar5 != lVar33);
      }
      prVar14 = (rnnbitset *)0x0;
LAB_0010356d:
      if (prVar14 == (rnnbitset *)0x0) {
        prVar14 = (rnnbitset *)calloc(0x70,1);
        pcVar25 = strdup(pcVar25);
        prVar14->name = pcVar25;
        prVar14->isinline = iVar4;
        prVar14->bare = iVar2;
        (prVar14->varinfo).prefixstr = local_60;
        (prVar14->varinfo).varsetstr = local_48;
        (prVar14->varinfo).variantsstr = local_40;
        prVar14->file = file;
        iVar2 = db->bitsetsmax;
        if (iVar2 <= iVar5) {
          iVar4 = 0x10;
          if (iVar2 != 0) {
            iVar4 = iVar2 * 2;
          }
          db->bitsetsmax = iVar4;
          pprVar15 = (rnnbitset **)realloc(db->bitsets,(long)iVar4 << 3);
          db->bitsets = pprVar15;
        }
        iVar2 = db->bitsetsnum;
        db->bitsetsnum = iVar2 + 1;
        db->bitsets[iVar2] = prVar14;
      }
      else {
        pcVar25 = (prVar14->varinfo).prefixstr;
        if ((((local_60 != (char *)0x0 || pcVar25 != (char *)0x0) &&
             (((local_60 == (char *)0x0 || (pcVar25 == (char *)0x0)) ||
              (iVar5 = strcmp(pcVar25,local_60), iVar5 != 0)))) ||
            ((pcVar25 = (prVar14->varinfo).varsetstr,
             local_48 != (char *)0x0 || pcVar25 != (char *)0x0 &&
             (((local_48 == (char *)0x0 || (pcVar25 == (char *)0x0)) ||
              (iVar5 = strcmp(pcVar25,local_48), iVar5 != 0)))))) ||
           (((pcVar25 = (prVar14->varinfo).variantsstr,
             local_40 != (char *)0x0 || pcVar25 != (char *)0x0 &&
             (((local_40 == (char *)0x0 || (pcVar25 == (char *)0x0)) ||
              (iVar5 = strcmp(pcVar25,local_40), iVar5 != 0)))) ||
            ((prVar14->isinline != iVar4 || (prVar14->bare != iVar2)))))) {
          fprintf(_stderr,"%s:%d: merge fail for bitset %s\n",file,(ulong)node->line,node->name);
          db->estatus = 1;
        }
      }
      for (prVar34 = (rnndb *)node->children; prVar34 != (rnndb *)0x0;
          prVar34 = (rnndb *)prVar34->bitsets) {
        if (*(int *)&(prVar34->copyright).license == 1) {
          iVar2 = strcmp((char *)(prVar34->copyright).authors,"bitfield");
          if (iVar2 == 0) {
            prVar16 = parsebitfield(db,file,(xmlNode *)prVar34);
            if (prVar16 != (rnnbitfield *)0x0) {
              iVar2 = prVar14->bitfieldsmax;
              if (iVar2 <= prVar14->bitfieldsnum) {
                iVar4 = iVar2 * 2;
                if (iVar2 == 0) {
                  iVar4 = 0x10;
                }
                prVar14->bitfieldsmax = iVar4;
                pprVar17 = (rnnbitfield **)realloc(prVar14->bitfields,(long)iVar4 << 3);
                prVar14->bitfields = pprVar17;
              }
              iVar2 = prVar14->bitfieldsnum;
              prVar14->bitfieldsnum = iVar2 + 1;
              prVar14->bitfields[iVar2] = prVar16;
            }
          }
          else {
            pcVar25 = file;
            iVar2 = trytop(db,file,(xmlNode *)prVar34);
            if ((iVar2 == 0) && (iVar2 = trydoc(prVar34,pcVar25,node_01), iVar2 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in bitset: <%s>\n",file,
                      (ulong)*(ushort *)&prVar34->files,(prVar34->copyright).authors);
              db->estatus = 1;
            }
          }
        }
      }
      return 1;
    }
    uVar30 = (ulong)node->line;
    pcVar25 = "%s:%d: nameless bitset\n";
    goto LAB_00104312;
  }
  iVar2 = strcmp((char *)pxVar1,"group");
  if (iVar2 == 0) {
    p_Var32 = node->properties;
    if (p_Var32 == (_xmlAttr *)0x0) {
      pcVar25 = (char *)0x0;
    }
    else {
      pcVar25 = (char *)0x0;
      do {
        pxVar1 = p_Var32->name;
        iVar2 = strcmp((char *)pxVar1,"name");
        if (iVar2 == 0) {
          pcVar25 = getattrib(db,file,(uint)node->line,p_Var32);
        }
        else {
          fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for group\n",file,(ulong)node->line,pxVar1)
          ;
          db->estatus = 1;
        }
        p_Var32 = p_Var32->next;
      } while (p_Var32 != (_xmlAttr *)0x0);
    }
    if (pcVar25 != (char *)0x0) {
      iVar2 = db->groupsnum;
      if (0 < (long)iVar2) {
        pprVar21 = db->groups;
        lVar33 = 0;
        do {
          prVar20 = pprVar21[lVar33];
          iVar4 = strcmp(prVar20->name,pcVar25);
          if (iVar4 == 0) goto LAB_00103a04;
          lVar33 = lVar33 + 1;
        } while (iVar2 != lVar33);
      }
      prVar20 = (rnngroup *)0x0;
LAB_00103a04:
      if (prVar20 == (rnngroup *)0x0) {
        prVar20 = (rnngroup *)calloc(0x18,1);
        pcVar25 = strdup(pcVar25);
        prVar20->name = pcVar25;
        iVar4 = db->groupsmax;
        if (iVar4 <= iVar2) {
          iVar2 = 0x10;
          if (iVar4 != 0) {
            iVar2 = iVar4 * 2;
          }
          db->groupsmax = iVar2;
          pprVar21 = (rnngroup **)realloc(db->groups,(long)iVar2 << 3);
          db->groups = pprVar21;
        }
        iVar2 = db->groupsnum;
        db->groupsnum = iVar2 + 1;
        db->groups[iVar2] = prVar20;
      }
      for (prVar34 = (rnndb *)node->children; prVar34 != (rnndb *)0x0;
          prVar34 = (rnndb *)prVar34->bitsets) {
        if (*(int *)&(prVar34->copyright).license == 1) {
          prVar28 = trydelem(db,file,(xmlNode *)prVar34);
          if (prVar28 == (rnndelem *)0x0) {
            pcVar25 = file;
            iVar2 = trytop(db,file,(xmlNode *)prVar34);
            if ((iVar2 == 0) && (iVar2 = trydoc(prVar34,pcVar25,node_03), iVar2 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in group: <%s>\n",file,
                      (ulong)*(ushort *)&prVar34->files,(prVar34->copyright).authors);
              db->estatus = 1;
            }
          }
          else {
            iVar2 = prVar20->subelemsmax;
            if (iVar2 <= prVar20->subelemsnum) {
              iVar4 = iVar2 * 2;
              if (iVar2 == 0) {
                iVar4 = 0x10;
              }
              prVar20->subelemsmax = iVar4;
              pprVar29 = (rnndelem **)realloc(prVar20->subelems,(long)iVar4 << 3);
              prVar20->subelems = pprVar29;
            }
            iVar2 = prVar20->subelemsnum;
            prVar20->subelemsnum = iVar2 + 1;
            prVar20->subelems[iVar2] = prVar28;
          }
        }
      }
      return 1;
    }
    uVar30 = (ulong)node->line;
    pcVar25 = "%s:%d: nameless group\n";
    goto LAB_00104312;
  }
  iVar2 = strcmp((char *)pxVar1,"domain");
  if (iVar2 != 0) {
    iVar2 = strcmp((char *)pxVar1,"spectype");
    if (iVar2 == 0) {
      prVar18 = (rnnspectype *)calloc(0x88,1);
      prVar18->file = file;
      p_Var32 = node->properties;
      if (p_Var32 != (_xmlAttr *)0x0) {
        do {
          iVar2 = strcmp((char *)p_Var32->name,"name");
          if (iVar2 == 0) {
            pcVar25 = getattrib(db,file,(uint)node->line,p_Var32);
            pcVar25 = strdup(pcVar25);
            prVar18->name = pcVar25;
          }
          else {
            iVar2 = trytypeattr(db,file,node,p_Var32,&prVar18->typeinfo);
            if (iVar2 == 0) {
              fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for spectype\n",file,(ulong)node->line,
                      p_Var32->name);
              db->estatus = 1;
            }
          }
          p_Var32 = p_Var32->next;
        } while (p_Var32 != (_xmlAttr *)0x0);
      }
      pcVar25 = prVar18->name;
      if (pcVar25 != (char *)0x0) {
        iVar2 = db->spectypesnum;
        if (0 < (long)iVar2) {
          pprVar19 = db->spectypes;
          lVar33 = 0;
          do {
            iVar4 = strcmp(pprVar19[lVar33]->name,pcVar25);
            if (iVar4 == 0) {
              fprintf(_stderr,"%s:%d: duplicated spectype name %s\n",file,(ulong)node->line,pcVar25)
              ;
              goto LAB_0010436a;
            }
            lVar33 = lVar33 + 1;
          } while (iVar2 != lVar33);
        }
        iVar4 = db->spectypesmax;
        if (iVar4 <= iVar2) {
          iVar2 = 0x10;
          if (iVar4 != 0) {
            iVar2 = iVar4 * 2;
          }
          db->spectypesmax = iVar2;
          pprVar19 = (rnnspectype **)realloc(db->spectypes,(long)iVar2 << 3);
          db->spectypes = pprVar19;
        }
        iVar2 = db->spectypesnum;
        db->spectypesnum = iVar2 + 1;
        db->spectypes[iVar2] = prVar18;
        prVar34 = (rnndb *)node->children;
        if (prVar34 != (rnndb *)0x0) {
          do {
            if ((((*(int *)&(prVar34->copyright).license == 1) &&
                 (iVar2 = trytypetag(db,file,(xmlNode *)prVar34,&prVar18->typeinfo), iVar2 == 0)) &&
                (pcVar25 = file, iVar2 = trytop(db,file,(xmlNode *)prVar34), iVar2 == 0)) &&
               (iVar2 = trydoc(prVar34,pcVar25,node_02), iVar2 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in spectype: <%s>\n",file,
                      (ulong)*(ushort *)&prVar34->files,(prVar34->copyright).authors);
              db->estatus = 1;
            }
            prVar34 = (rnndb *)prVar34->bitsets;
          } while (prVar34 != (rnndb *)0x0);
          return 1;
        }
        return 1;
      }
      uVar30 = (ulong)node->line;
      pcVar25 = "%s:%d: nameless spectype\n";
    }
    else {
      iVar2 = strcmp((char *)pxVar1,"import");
      if (iVar2 != 0) {
        iVar2 = strcmp((char *)pxVar1,"copyright");
        if (iVar2 != 0) {
          return 0;
        }
        for (attr = node->properties; attr != (xmlAttr *)0x0; attr = attr->next) {
          pxVar1 = attr->name;
          iVar2 = strcmp((char *)pxVar1,"year");
          if (iVar2 == 0) {
            uVar7 = getnumattrib(db,file,(uint)node->line,attr);
            if ((uint)uVar7 <= (db->copyright).firstyear - 1) {
              (db->copyright).firstyear = (uint)uVar7;
            }
          }
          else {
            fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for copyright\n",file,(ulong)node->line,
                    pxVar1);
            db->estatus = 1;
          }
        }
        attr_00 = node->children;
        do {
          if (attr_00 == (xmlNode *)0x0) {
            return 1;
          }
          if (attr_00->type == XML_ELEMENT_NODE) {
            pxVar1 = attr_00->name;
            iVar2 = strcmp((char *)pxVar1,"license");
            if (iVar2 == 0) {
              pcVar25 = (db->copyright).license;
              if (pcVar25 == (char *)0x0) {
                pcVar25 = getcontent(attr_00);
                (db->copyright).license = pcVar25;
              }
              else {
                iVar2 = strcmp(pcVar25,(char *)node->content);
                if (iVar2 != 0) {
                  trytop_cold_1();
                  pcVar25 = *(char **)(pcVar25 + 0x10);
                  iVar2 = strcmp(pcVar25,"brief");
                  if (iVar2 == 0) {
                    uVar6 = 1;
                  }
                  else {
                    iVar2 = strcmp(pcVar25,"doc");
                    uVar6 = (uint)(iVar2 == 0);
                  }
                  return uVar6;
                }
              }
            }
            else {
              iVar2 = strcmp((char *)pxVar1,"author");
              if (iVar2 == 0) {
                prVar24 = (rnnauthor *)calloc(0x30,1);
                p_Var31 = attr_00->children;
                p_Var32 = attr_00->properties;
                pcVar25 = getcontent(attr_00);
                prVar24->contributions = pcVar25;
                for (; p_Var32 != (xmlAttr *)0x0; p_Var32 = p_Var32->next) {
                  pxVar1 = p_Var32->name;
                  iVar2 = strcmp((char *)pxVar1,"name");
                  if (iVar2 == 0) {
                    pcVar25 = getattrib(db,file,(uint)attr_00->line,p_Var32);
                    pcVar25 = strdup(pcVar25);
                    prVar24->name = pcVar25;
                  }
                  else {
                    iVar2 = strcmp((char *)pxVar1,"email");
                    if (iVar2 == 0) {
                      pcVar25 = getattrib(db,file,(uint)attr_00->line,p_Var32);
                      pcVar25 = strdup(pcVar25);
                      prVar24->email = pcVar25;
                    }
                    else {
                      fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for author\n",file,
                              (ulong)attr_00->line,pxVar1);
                      db->estatus = 1;
                    }
                  }
                }
                for (; p_Var31 != (_xmlNode *)0x0; p_Var31 = p_Var31->next) {
                  if (p_Var31->type == XML_ELEMENT_NODE) {
                    pxVar1 = p_Var31->name;
                    iVar2 = strcmp((char *)pxVar1,"nick");
                    if (iVar2 == 0) {
                      pcVar25 = (char *)0x0;
                      for (p_Var32 = p_Var31->properties; p_Var32 != (xmlAttr *)0x0;
                          p_Var32 = p_Var32->next) {
                        pxVar1 = p_Var32->name;
                        iVar2 = strcmp((char *)pxVar1,"name");
                        if (iVar2 == 0) {
                          pcVar25 = getattrib(db,file,(uint)p_Var31->line,p_Var32);
                          pcVar25 = strdup(pcVar25);
                        }
                        else {
                          fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for nick\n",file,
                                  (ulong)p_Var31->line,pxVar1);
                          db->estatus = 1;
                        }
                      }
                      if (pcVar25 != (char *)0x0) {
                        iVar2 = prVar24->nicknamesmax;
                        if (iVar2 <= prVar24->nicknamesnum) {
                          iVar4 = iVar2 * 2;
                          if (iVar2 == 0) {
                            iVar4 = 0x10;
                          }
                          prVar24->nicknamesmax = iVar4;
                          ppcVar26 = (char **)realloc(prVar24->nicknames,(long)iVar4 << 3);
                          prVar24->nicknames = ppcVar26;
                        }
                        iVar2 = prVar24->nicknamesnum;
                        prVar24->nicknamesnum = iVar2 + 1;
                        prVar24->nicknames[iVar2] = pcVar25;
                        goto LAB_0010401f;
                      }
                      fprintf(_stderr,"%s:%d: missing \"name\" attribute for nick\n",file,
                              (ulong)p_Var31->line);
                    }
                    else {
                      fprintf(_stderr,"%s:%d: wrong tag in author: <%s>\n",file,(ulong)p_Var31->line
                              ,pxVar1);
                    }
                    db->estatus = 1;
                  }
LAB_0010401f:
                }
                iVar2 = (db->copyright).authorsmax;
                if (iVar2 <= (db->copyright).authorsnum) {
                  iVar4 = iVar2 * 2;
                  if (iVar2 == 0) {
                    iVar4 = 0x10;
                  }
                  (db->copyright).authorsmax = iVar4;
                  pprVar27 = (rnnauthor **)realloc((db->copyright).authors,(long)iVar4 << 3);
                  (db->copyright).authors = pprVar27;
                }
                iVar2 = (db->copyright).authorsnum;
                (db->copyright).authorsnum = iVar2 + 1;
                (db->copyright).authors[iVar2] = prVar24;
              }
              else {
                fprintf(_stderr,"%s:%d: wrong tag in copyright: <%s>\n",file,(ulong)attr_00->line,
                        pxVar1);
                db->estatus = 1;
              }
            }
          }
          attr_00 = attr_00->next;
        } while( true );
      }
      p_Var32 = node->properties;
      if (p_Var32 == (_xmlAttr *)0x0) {
        pcVar25 = (char *)0x0;
      }
      else {
        pcVar25 = (char *)0x0;
        do {
          pxVar1 = p_Var32->name;
          iVar2 = strcmp((char *)pxVar1,"file");
          if (iVar2 == 0) {
            pcVar25 = getattrib(db,file,(uint)node->line,p_Var32);
          }
          else {
            fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for import\n",file,(ulong)node->line,
                    pxVar1);
            db->estatus = 1;
          }
          p_Var32 = p_Var32->next;
        } while (p_Var32 != (_xmlAttr *)0x0);
      }
      if (pcVar25 != (char *)0x0) {
        rnn_parsefile(db,pcVar25);
        return 1;
      }
      uVar30 = (ulong)node->line;
      pcVar25 = "%s:%d: missing \"file\" attribute for import\n";
    }
    goto LAB_00104312;
  }
  p_Var32 = node->properties;
  if (p_Var32 == (_xmlAttr *)0x0) {
    pcVar25 = (char *)0x0;
    local_60._0_4_ = 8;
    local_50 = 0;
    iVar2 = 0;
    pcVar13 = (char *)0x0;
    local_48 = (char *)0x0;
    local_40 = (char *)0x0;
  }
  else {
    local_60 = (char *)0x8;
    local_40 = (char *)0x0;
    local_48 = (char *)0x0;
    pcVar13 = (char *)0x0;
    iVar2 = 0;
    local_50 = 0;
    pcVar25 = (char *)0x0;
    do {
      pxVar1 = p_Var32->name;
      iVar4 = strcmp((char *)pxVar1,"name");
      if (iVar4 == 0) {
        pcVar25 = getattrib(db,file,(uint)node->line,p_Var32);
      }
      else {
        iVar4 = strcmp((char *)pxVar1,"bare");
        if (iVar4 == 0) {
          iVar2 = getboolattrib(db,file,(uint)node->line,p_Var32);
        }
        else {
          iVar4 = strcmp((char *)pxVar1,"size");
          if (iVar4 == 0) {
            local_50 = getnumattrib(db,file,(uint)node->line,p_Var32);
          }
          else {
            iVar4 = strcmp((char *)pxVar1,"width");
            if (iVar4 == 0) {
              local_60 = (char *)getnumattrib(db,file,(uint)node->line,p_Var32);
            }
            else {
              iVar4 = strcmp((char *)pxVar1,"prefix");
              if (iVar4 == 0) {
                pcVar13 = getattrib(db,file,(uint)node->line,p_Var32);
                pcVar13 = strdup(pcVar13);
              }
              else {
                iVar4 = strcmp((char *)pxVar1,"varset");
                if (iVar4 == 0) {
                  pcVar12 = getattrib(db,file,(uint)node->line,p_Var32);
                  local_48 = strdup(pcVar12);
                }
                else {
                  iVar4 = strcmp((char *)pxVar1,"variants");
                  if (iVar4 == 0) {
                    pcVar12 = getattrib(db,file,(uint)node->line,p_Var32);
                    local_40 = strdup(pcVar12);
                  }
                  else {
                    fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for domain\n",file,
                            (ulong)node->line,pxVar1);
                    db->estatus = 1;
                  }
                }
              }
            }
          }
        }
      }
      p_Var32 = p_Var32->next;
    } while (p_Var32 != (_xmlAttr *)0x0);
  }
  if (pcVar25 == (char *)0x0) {
    fprintf(_stderr,"%s:%d: nameless domain\n",file,(ulong)node->line);
LAB_0010436a:
    db->estatus = 1;
    return 1;
  }
  iVar4 = db->domainsnum;
  if (0 < (long)iVar4) {
    pprVar23 = db->domains;
    lVar33 = 0;
    do {
      prVar22 = pprVar23[lVar33];
      iVar5 = strcmp(prVar22->name,pcVar25);
      if (iVar5 == 0) goto LAB_00103c5a;
      lVar33 = lVar33 + 1;
    } while (iVar4 != lVar33);
  }
  prVar22 = (rnndomain *)0x0;
LAB_00103c5a:
  if (prVar22 == (rnndomain *)0x0) {
    prVar22 = (rnndomain *)calloc(0x80,1);
    pcVar25 = strdup(pcVar25);
    prVar22->name = pcVar25;
    prVar22->bare = iVar2;
    prVar22->width = (int)local_60;
    prVar22->size = local_50;
    (prVar22->varinfo).prefixstr = pcVar13;
    (prVar22->varinfo).varsetstr = local_48;
    (prVar22->varinfo).variantsstr = local_40;
    prVar22->file = file;
    iVar2 = db->domainsmax;
    if (iVar2 <= iVar4) {
      iVar4 = 0x10;
      if (iVar2 != 0) {
        iVar4 = iVar2 * 2;
      }
      db->domainsmax = iVar4;
      pprVar23 = (rnndomain **)realloc(db->domains,(long)iVar4 << 3);
      db->domains = pprVar23;
    }
    iVar2 = db->domainsnum;
    db->domainsnum = iVar2 + 1;
    db->domains[iVar2] = prVar22;
    goto LAB_00104189;
  }
  pcVar25 = (prVar22->varinfo).prefixstr;
  if (((((pcVar13 == (char *)0x0 && pcVar25 == (char *)0x0) ||
        (((pcVar13 != (char *)0x0 && (pcVar25 != (char *)0x0)) &&
         (iVar4 = strcmp(pcVar25,pcVar13), iVar4 == 0)))) &&
       ((pcVar25 = (prVar22->varinfo).varsetstr, local_48 == (char *)0x0 && pcVar25 == (char *)0x0
        || (((local_48 != (char *)0x0 && (pcVar25 != (char *)0x0)) &&
            (iVar4 = strcmp(pcVar25,local_48), iVar4 == 0)))))) &&
      ((pcVar25 = (prVar22->varinfo).variantsstr, local_40 == (char *)0x0 && pcVar25 == (char *)0x0
       || (((local_40 != (char *)0x0 && (pcVar25 != (char *)0x0)) &&
           (iVar4 = strcmp(pcVar25,local_40), iVar4 == 0)))))) &&
     ((prVar22->width == (int)local_60 && (prVar22->bare == iVar2)))) {
    if (local_50 == 0) goto LAB_00104189;
    if ((prVar22->size == 0) || (local_50 == prVar22->size)) {
      prVar22->size = local_50;
      goto LAB_00104189;
    }
  }
  fprintf(_stderr,"%s:%d: merge fail for domain %s\n",file,(ulong)node->line,node->name);
  db->estatus = 1;
LAB_00104189:
  for (prVar34 = (rnndb *)node->children; prVar34 != (rnndb *)0x0;
      prVar34 = (rnndb *)prVar34->bitsets) {
    if (*(int *)&(prVar34->copyright).license == 1) {
      prVar28 = trydelem(db,file,(xmlNode *)prVar34);
      if (prVar28 == (rnndelem *)0x0) {
        pcVar25 = file;
        iVar2 = trytop(db,file,(xmlNode *)prVar34);
        if ((iVar2 == 0) && (iVar2 = trydoc(prVar34,pcVar25,node_04), iVar2 == 0)) {
          fprintf(_stderr,"%s:%d: wrong tag in domain: <%s>\n",file,
                  (ulong)*(ushort *)&prVar34->files,(prVar34->copyright).authors);
          db->estatus = 1;
        }
      }
      else {
        iVar2 = prVar22->subelemsmax;
        if (iVar2 <= prVar22->subelemsnum) {
          iVar4 = iVar2 * 2;
          if (iVar2 == 0) {
            iVar4 = 0x10;
          }
          prVar22->subelemsmax = iVar4;
          pprVar29 = (rnndelem **)realloc(prVar22->subelems,(long)iVar4 << 3);
          prVar22->subelems = pprVar29;
        }
        iVar2 = prVar22->subelemsnum;
        prVar22->subelemsnum = iVar2 + 1;
        prVar22->subelems[iVar2] = prVar28;
      }
    }
  }
  return 1;
}

Assistant:

static int trytop (struct rnndb *db, char *file, xmlNode *node) {
	if (!strcmp(node->name, "enum")) {
		parseenum(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "bitset")) {
		parsebitset(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "group")) {
		parsegroup(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "domain")) {
		parsedomain(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "spectype")) {
		parsespectype(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "import")) {
		xmlAttr *attr = node->properties;
		char *subfile = 0;
		while (attr) {
			if (!strcmp(attr->name, "file")) {
				subfile = getattrib(db, file, node->line, attr);
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for import\n", file, node->line, attr->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		if (!subfile) {
			fprintf (stderr, "%s:%d: missing \"file\" attribute for import\n", file, node->line);
			db->estatus = 1;
		} else {
			rnn_parsefile(db, subfile);
		}
		return 1;
	} else if (!strcmp(node->name, "copyright")) {
		parsecopyright(db, file, node);
		return 1;
	}
	return 0;
}